

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O1

bool tinyusdz::anon_unknown_28::FindPrimByPrimIdRec
               (uint64_t prim_id,Prim *root,Prim **primFound,int level,string *err)

{
  Prim *pPVar1;
  bool bVar2;
  Prim *root_00;
  bool bVar3;
  
  if (primFound == (Prim **)0x0 || 0x8000000 < level) {
    bVar3 = false;
  }
  else if (root->_prim_id == prim_id) {
    *primFound = root;
    bVar3 = true;
  }
  else {
    root_00 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (root->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar3 = root_00 != pPVar1;
    if (bVar3) {
      bVar2 = FindPrimByPrimIdRec(prim_id,root_00,primFound,level + 1,err);
      while (!bVar2) {
        root_00 = root_00 + 1;
        bVar3 = root_00 != pPVar1;
        if (root_00 == pPVar1) {
          return bVar3;
        }
        bVar2 = FindPrimByPrimIdRec(prim_id,root_00,primFound,level + 1,err);
      }
    }
  }
  return bVar3;
}

Assistant:

bool FindPrimByPrimIdRec(uint64_t prim_id, const Prim *root,
                         const Prim **primFound, int level, std::string *err) {
  if (level > 1024 * 1024 * 128) {
    // too deep node.
    return false;
  }

  if (!primFound) {
    return false;
  }

  if (root->prim_id() == int64_t(prim_id)) {
    (*primFound) = root;
    return true;
  }

  // Brute-force search.
  for (const auto &child : root->children()) {
    if (FindPrimByPrimIdRec(prim_id, &child, primFound, level + 1, err)) {
      return true;
    }
  }

  return false;
}